

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMU_PUBLIC_ID_Unmarshal(TPMU_PUBLIC_ID *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  TPM_RC TVar1;
  
  if (selector == 1) {
    TVar1 = UINT16_Unmarshal((UINT16 *)target,buffer,size);
    if (TVar1 == 0) {
      TVar1 = 0x95;
      if (*(ushort *)target < 0x101) {
        TVar1 = BYTE_Array_Unmarshal((target->ecc).x.t.buffer,buffer,size,(uint)*(ushort *)target);
        return TVar1;
      }
    }
    return TVar1;
  }
  if (selector != 0x25) {
    if (selector == 0x23) {
      TVar1 = TPM2B_ECC_PARAMETER_Unmarshal((TPM2B_ECC_PARAMETER *)target,buffer,size);
      if (TVar1 != 0) {
        return TVar1;
      }
      TVar1 = TPM2B_ECC_PARAMETER_Unmarshal(&(target->ecc).y,buffer,size);
      return TVar1;
    }
    if (selector != 8) {
      return 0x98;
    }
  }
  TVar1 = UINT16_Unmarshal((UINT16 *)target,buffer,size);
  if (TVar1 == 0) {
    TVar1 = 0x95;
    if (*(ushort *)target < 0x41) {
      TVar1 = BYTE_Array_Unmarshal((target->ecc).x.t.buffer,buffer,size,(uint)*(ushort *)target);
      return TVar1;
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPMU_PUBLIC_ID_Unmarshal(TPMU_PUBLIC_ID *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_KEYEDHASH
        case TPM_ALG_KEYEDHASH:
            return TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->keyedHash), buffer, size);
#endif // ALG_KEYEDHASH
#if         ALG_SYMCIPHER
        case TPM_ALG_SYMCIPHER:
            return TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->sym), buffer, size);
#endif // ALG_SYMCIPHER
#if         ALG_RSA
        case TPM_ALG_RSA:
            return TPM2B_PUBLIC_KEY_RSA_Unmarshal((TPM2B_PUBLIC_KEY_RSA *)&(target->rsa), buffer, size);
#endif // ALG_RSA
#if         ALG_ECC
        case TPM_ALG_ECC:
            return TPMS_ECC_POINT_Unmarshal((TPMS_ECC_POINT *)&(target->ecc), buffer, size);
#endif // ALG_ECC
    }
    return TPM_RC_SELECTOR;
}